

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

void highsOpenLogFile(HighsLogOptions *log_options,
                     vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                     string *log_file)

{
  OptionStatus OVar1;
  int iVar2;
  char *__filename;
  FILE *pFVar3;
  reference ppOVar4;
  HighsLogOptions *in_RDX;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RSI;
  long *in_RDI;
  OptionRecordString *option;
  OptionStatus status;
  HighsInt index;
  string *in_stack_ffffffffffffff48;
  HighsInt *in_stack_ffffffffffffff50;
  OptionRecordString *this;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string local_80 [32];
  OptionRecordString *local_60;
  allocator local_41;
  string local_40 [32];
  OptionStatus local_20;
  int local_1c;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"log_file",&local_41);
  OVar1 = getOptionIndex(in_RDX,(string *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = OVar1;
  if (*local_8 != 0) {
    fflush((FILE *)*local_8);
    fclose((FILE *)*local_8);
  }
  iVar2 = std::__cxx11::string::compare((char *)in_RDX);
  if (iVar2 == 0) {
    *local_8 = 0;
  }
  else {
    __filename = (char *)std::__cxx11::string::c_str();
    pFVar3 = fopen(__filename,"a");
    *local_8 = (long)pFVar3;
  }
  ppOVar4 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                      (local_10,(long)local_1c);
  this = (OptionRecordString *)*ppOVar4;
  local_60 = this;
  std::__cxx11::string::string(local_80,(string *)in_RDX);
  OptionRecordString::assignvalue(this,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void highsOpenLogFile(HighsLogOptions& log_options,
                      std::vector<OptionRecord*>& option_records,
                      const std::string log_file) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(log_options, "log_file", option_records, index);
  assert(status == OptionStatus::kOk);
  if (log_options.log_stream != NULL) {
    // Current log file stream is not null, so flush and close it
    fflush(log_options.log_stream);
    fclose(log_options.log_stream);
  }
  if (log_file.compare("")) {
    // New log file name is not empty, so open it, appending if
    // possible
    log_options.log_stream = fopen(log_file.c_str(), "a");
  } else {
    // New log file name is empty, so set the stream to null
    log_options.log_stream = NULL;
  }
  OptionRecordString& option = *(OptionRecordString*)option_records[index];
  option.assignvalue(log_file);
}